

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O2

Color __thiscall
PlasticBSDF::sample_f
          (PlasticBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit,bool *isDirac,Sampler *sampler)

{
  vec3f *pvVar1;
  undefined1 auVar2 [16];
  vec3f *b;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar5 [16];
  Color CVar6;
  vec3f vVar7;
  float pdf;
  float local_11c;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  vec3f *local_d8;
  vec3f *local_d0;
  vec3f local_c8;
  float local_b8;
  float fStack_b4;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  Color local_70;
  vec3f local_60;
  vec3f local_50;
  vec3f local_40;
  
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 0.0;
  pvVar1 = &(hit->super_Hit).Ns;
  local_118 = isDirac;
  local_e8 = sampler;
  local_d8 = pvVar1;
  local_d0 = wi;
  BSDF::getLocalBasis(pvVar1,&local_40,&local_50);
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  local_c8.z = 0.0;
  local_108 = ZEXT416((uint)wo->x);
  local_88 = ZEXT416((uint)wo->y);
  local_f8 = ZEXT416((uint)wo->z);
  local_a8 = local_40.x;
  fStack_a4 = local_50.x;
  uStack_a0 = 0;
  local_b8 = local_40.y;
  fStack_b4 = local_50.y;
  uStack_b0 = 0;
  local_98 = local_40.z;
  fStack_94 = local_50.z;
  uStack_90 = 0;
  local_60.z = dot(wo,pvVar1);
  local_60.x = (float)local_f8._0_4_ * local_98 +
               (float)local_108._0_4_ * local_a8 + (float)local_88._0_4_ * local_b8;
  local_60.y = (float)local_f8._0_4_ * fStack_94 +
               (float)local_108._0_4_ * fStack_a4 + (float)local_88._0_4_ * fStack_b4;
  CVar6 = BSDF::albedo(&this->super_BSDF,&(hit->super_Hit).uv);
  local_70.z = CVar6.z;
  local_70._0_8_ = CVar6._0_8_;
  CVar6 = sample_f(this,&local_70,&local_60,&local_c8,&local_11c,local_118,local_e8);
  local_f8._8_4_ = extraout_XMM0_Dc;
  local_f8._0_8_ = CVar6._0_8_;
  local_f8._12_4_ = extraout_XMM0_Dd;
  local_108._0_4_ = CVar6.z;
  fVar3 = local_c8.x;
  fVar4 = local_c8.y;
  fStack_110 = local_50.z * fVar4;
  local_118 = (bool *)CONCAT44(fStack_110,fStack_110 + local_40.z * fVar3);
  local_e8._0_4_ = fVar4 * local_50.x + fVar3 * local_40.x;
  local_e8._4_4_ = fVar4 * local_50.y + fVar3 * local_40.y;
  fStack_e0 = fVar4 * 0.0 + fVar4 * 0.0;
  fStack_dc = fVar4 * 0.0 + fVar4 * 0.0;
  fStack_10c = fStack_110;
  vVar7 = operator*(local_c8.z,local_d8);
  pvVar1 = local_d0;
  local_d0->x = vVar7.x + (float)local_e8;
  local_d0->y = vVar7.y + local_e8._4_4_;
  local_d0->z = vVar7.z + (float)local_118;
  b = &(hit->super_Hit).Ng;
  fVar3 = dot(wo,b);
  local_118 = (bool *)CONCAT44(extraout_XMM0_Db,fVar3);
  fVar4 = dot(pvVar1,b);
  fVar3 = 0.0;
  auVar5 = ZEXT816(0);
  if (0.0 < fVar4 == 0.0 < (float)local_118) {
    fVar3 = (float)local_108._0_4_;
    auVar5 = local_f8;
  }
  CVar6.z = fVar3 / local_11c;
  auVar2._4_4_ = local_11c;
  auVar2._0_4_ = local_11c;
  auVar2._8_4_ = local_11c;
  auVar2._12_4_ = local_11c;
  auVar5 = divps(auVar5,auVar2);
  CVar6.x = (float)(int)auVar5._0_8_;
  CVar6.y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  return CVar6;
}

Assistant:

Color sample_f(const vec3f& wo, vec3f& wi, const HitInfo& hit, bool& isDirac, Sampler& sampler) const
	{
		// generate sample
		vec3f N1,N2;
		getLocalBasis(hit.Ns, N1, N2);
		vec3f wiL, woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
		float pdf;
		Color f0 = sample_f(albedo(hit.uv), woL, wiL, pdf, isDirac, sampler);
		wi = wiL.x * N1 + wiL.y * N2 + wiL.z * hit.Ns;
		// recalculate to make sure
		// Ng is used to determine whether BRDF or BTDF is used
		bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
		BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
		Color val = (BxDF::REFLECT & allowed)? f0: 0;
		return val / pdf;
	}